

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::TextureSwizzle::SmokeTest::iterate(SmokeTest *this)

{
  bool bVar1;
  uint uVar2;
  size_t format_idx_00;
  size_t target_idx;
  NotSupportedError *this_00;
  TestError *this_01;
  TestContext *this_02;
  undefined1 local_b8 [8];
  testCase test_case;
  size_t channel_idx;
  size_t a;
  size_t b;
  size_t g;
  size_t r;
  size_t access_idx;
  GLint local_38;
  GLint local_34;
  GLint source_channel_sizes [4];
  size_t tgt_idx;
  size_t format_idx;
  SmokeTest *this_local;
  
  format_idx_00 = get_index_of_format(0x8d70);
  target_idx = get_index_of_target(0x8c1a);
  memset(&local_38,0,0x10);
  testInit(this);
  bVar1 = isTargetSupported(this,target_idx);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture target is not support by implementation","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x9ba);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  prepareSourceTexture(this,format_idx_00,target_idx,&local_38);
  uVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,format_idx_00,target_idx);
  if ((uVar2 & 1) != 0) {
    for (r = 0; r < 0xe; r = r + 1) {
      bVar1 = isTargetSuppByAccess(this,r,target_idx);
      if (bVar1) {
        for (g = 0; g < 6; g = g + 1) {
          for (b = 0; b < 6; b = b + 1) {
            for (a = 0; a < 6; a = a + 1) {
              for (channel_idx = 0; channel_idx < 6; channel_idx = channel_idx + 1) {
                test_case.m_texture_sizes[2] = 0;
                test_case.m_texture_sizes[3] = 0;
                for (; (ulong)test_case.m_texture_sizes._8_8_ < 4;
                    test_case.m_texture_sizes._8_8_ = test_case.m_texture_sizes._8_8_ + 1) {
                  local_b8._0_4_ = test_case.m_texture_sizes[2];
                  local_b8._4_4_ = test_case.m_texture_sizes[3];
                  test_case.m_source_texture_target_index = r;
                  test_case.m_texture_access_index._0_4_ = *(undefined4 *)(valid_values + g * 4);
                  test_case.m_texture_access_index._4_4_ = *(undefined4 *)(valid_values + b * 4);
                  test_case.m_texture_swizzle_red = *(GLint *)(valid_values + a * 4);
                  test_case.m_texture_swizzle_green = *(GLint *)(valid_values + channel_idx * 4);
                  test_case.m_texture_swizzle_blue = local_38;
                  test_case.m_texture_swizzle_alpha = local_34;
                  test_case.m_texture_sizes[0] = source_channel_sizes[0];
                  test_case.m_texture_sizes[1] = source_channel_sizes[1];
                  test_case.m_channel_index = format_idx_00;
                  test_case.m_source_texture_format_index = target_idx;
                  executeTestCase(this,(testCase *)local_b8);
                  deinitOutputTexture(this);
                }
              }
            }
          }
        }
      }
    }
    this_02 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(this_02,QP_TEST_RESULT_PASS,"Pass");
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Failed to prepare source texture",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
             ,0x9c1);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult SmokeTest::iterate()
{
	static const glw::GLenum tested_format = GL_RGBA32UI;
	static const glw::GLenum tested_target = GL_TEXTURE_2D_ARRAY;

	const size_t format_idx = get_index_of_format(tested_format);
	const size_t tgt_idx	= get_index_of_target(tested_target);

	glw::GLint source_channel_sizes[4] = { 0 };

	/*  */
	testInit();

	if (false == isTargetSupported(tgt_idx))
	{
		throw tcu::NotSupportedError("Texture target is not support by implementation", "", __FILE__, __LINE__);
	}

	/* Prepare and fill source texture */
	prepareSourceTexture(format_idx, tgt_idx, source_channel_sizes);
	if (false == fillSourceTexture(format_idx, tgt_idx))
	{
		TCU_FAIL("Failed to prepare source texture");
	}

	/* Iterate over all cases */
	for (size_t access_idx = 0; access_idx < n_texture_access; ++access_idx)
	{
		/* Skip invalid cases */
		if (false == isTargetSuppByAccess(access_idx, tgt_idx))
		{
			continue;
		}

		for (size_t r = 0; r < n_valid_values; ++r)
		{
			for (size_t g = 0; g < n_valid_values; ++g)
			{
				for (size_t b = 0; b < n_valid_values; ++b)
				{
					for (size_t a = 0; a < n_valid_values; ++a)
					{
						for (size_t channel_idx = 0; channel_idx < 4; ++channel_idx)
						{
							const testCase test_case = { channel_idx,
														 format_idx,
														 tgt_idx,
														 access_idx,
														 valid_values[r],
														 valid_values[g],
														 valid_values[b],
														 valid_values[a],
														 { source_channel_sizes[0], source_channel_sizes[1],
														   source_channel_sizes[2], source_channel_sizes[3] } };

							executeTestCase(test_case);

							deinitOutputTexture();
						} /* iteration over channels */
					}	 /* iteration over swizzle combinations */
				}
			}
		}
	} /* iteration over access routines */

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}